

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

int luaV_lessequal(lua_State *L,TValue *l,TValue *r)

{
  unsigned_short *puVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  char *__assertion;
  
  uVar2 = l->tt_ & 0xf;
  if (uVar2 == 4) {
    if ((r->tt_ & 0xf) == 4) {
      if ((((TString *)(l->value_).gc)->tt & 0xf) == 4) {
        if ((((TString *)(r->value_).gc)->tt & 0xf) == 4) {
          iVar3 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
          return (uint)(iVar3 < 1);
        }
        __assertion = "(((((r)->value_).gc)->tt) & 0x0F) == 4";
      }
      else {
        __assertion = "(((((l)->value_).gc)->tt) & 0x0F) == 4";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ca,"int luaV_lessequal(lua_State *, const TValue *, const TValue *)");
    }
  }
  else if ((uVar2 == 3) && ((r->tt_ & 0xf) == 3)) {
    iVar3 = LEnum(l,r);
    return iVar3;
  }
  uVar4 = luaT_callorderTM(L,l,r,TM_LE);
  if ((int)uVar4 < 0) {
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 | 0x80;
    iVar3 = luaT_callorderTM(L,r,l,TM_LT);
    puVar1 = &L->ci->callstatus;
    *puVar1 = *puVar1 ^ 0x80;
    if (iVar3 < 0) {
      luaG_ordererror(L,l,r);
    }
    uVar4 = (uint)(iVar3 == 0);
  }
  return uVar4;
}

Assistant:

int luaV_lessequal (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LEnum(l, r);
  else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
    return l_strcmp(tsvalue(l), tsvalue(r)) <= 0;
  else if ((res = luaT_callorderTM(L, l, r, TM_LE)) >= 0)  /* try 'le' */
    return res;
  else {  /* try 'lt': */
    L->ci->callstatus |= CIST_LEQ;  /* mark it is doing 'lt' for 'le' */
    res = luaT_callorderTM(L, r, l, TM_LT);
    L->ci->callstatus ^= CIST_LEQ;  /* clear mark */
    if (res < 0)
      luaG_ordererror(L, l, r);
    return !res;  /* result is negated */
  }
}